

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBoxPrivate::buttonClicked(QMessageBoxPrivate *this,QAbstractButton *button)

{
  QObject *pQVar1;
  DetailButton *this_00;
  Data *pDVar2;
  char *pcVar3;
  QObject *pQVar4;
  char *pcVar5;
  
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_00 = this->detailsButton;
  if ((this_00 != (DetailButton *)0x0) &&
     (this_00 == (DetailButton *)button && this->detailsText != (QMessageBoxDetailsText *)0x0)) {
    DetailButton::setLabel
              (this_00,((this->detailsText->super_QWidget).data)->widget_attributes >> 0x10 &
                       HideLabel);
    QWidget::setHidden(&this->detailsText->super_QWidget,
                       (((this->detailsText->super_QWidget).data)->widget_attributes >> 0x10 & 1) ==
                       0);
    updateSize(this);
    return;
  }
  setClickedButton(this,button);
  pDVar2 = (this->receiverToDisconnectOnClose).wp.d;
  if ((pDVar2 != (Data *)0x0) &&
     ((*(int *)(pDVar2 + 4) != 0 && ((this->receiverToDisconnectOnClose).wp.value != (QObject *)0x0)
      ))) {
    pcVar5 = (this->signalToDisconnectOnClose).d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->receiverToDisconnectOnClose).wp.value;
    }
    pcVar3 = (this->memberToDisconnectOnClose).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(pQVar1,pcVar5,pQVar4,pcVar3);
    pDVar2 = (this->receiverToDisconnectOnClose).wp.d;
    (this->receiverToDisconnectOnClose).wp.d = (Data *)0x0;
    (this->receiverToDisconnectOnClose).wp.value = (QObject *)0x0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
  }
  QByteArray::clear();
  QByteArray::clear();
  return;
}

Assistant:

void QMessageBoxPrivate::buttonClicked(QAbstractButton *button)
{
    Q_Q(QMessageBox);
#if QT_CONFIG(textedit)
    if (detailsButton && detailsText && button == detailsButton) {
        detailsButton->setLabel(detailsText->isHidden() ? HideLabel : ShowLabel);
        detailsText->setHidden(!detailsText->isHidden());
        updateSize();
    } else
#endif
    {
        setClickedButton(button);

        if (receiverToDisconnectOnClose) {
            QObject::disconnect(q, signalToDisconnectOnClose, receiverToDisconnectOnClose,
                                memberToDisconnectOnClose);
            receiverToDisconnectOnClose = nullptr;
        }
        signalToDisconnectOnClose.clear();
        memberToDisconnectOnClose.clear();
    }
}